

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetBoundingBoxProjectionExtents
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Interval *x_extents,ON_Interval *y_extents)

{
  ON_3dPoint from_pt;
  ON_PlaneEquation e_00;
  ON_PlaneEquation e_01;
  ON_PlaneEquation e_02;
  ON_3dPoint to_pt;
  ON_Viewport *this_00;
  bool bVar1;
  bool bVar2;
  ON_BoundingBox *pOVar3;
  double *pdVar4;
  ulong uVar5;
  int i;
  long lVar6;
  int j;
  int i_00;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  ON_3dPoint clipping_point;
  ON_BoundingBox clipping_bbox;
  double t;
  ON_3dPoint cam_loc;
  ON_PlaneEquation vp_far_plane;
  ON_PlaneEquation vp_near_plane;
  ON_Interval unit_interval;
  ON_3dPoint P;
  ON_3dPoint far_rect [4];
  ON_Line camera_ray;
  ON_3dPoint bbox_point;
  ON_PlaneEquation e;
  ON_Line *local_548;
  ON_3dPoint local_538;
  double local_520;
  double local_518;
  ON_Interval *local_510;
  ON_Interval *local_508;
  ON_Viewport *local_500;
  ulong local_4f8;
  ON_3dPoint local_4f0;
  ON_BoundingBox local_4d8;
  ON_Line local_4a8;
  ON_3dPoint local_478;
  ON_PlaneEquation local_458;
  ON_PlaneEquation local_438;
  ON_Interval local_418;
  ON_PlaneEquation local_408 [4];
  ON_3dPoint local_388;
  ON_3dPoint local_370;
  ON_3dPoint local_358;
  ON_3dPoint local_340;
  ON_Line local_328;
  ON_Xform local_2f8;
  ON_Line local_278 [12];
  
  ON_Interval::ON_Interval(&local_418,0.0,1.0);
  x_extents->m_t[0] = local_418.m_t[0];
  x_extents->m_t[1] = local_418.m_t[1];
  y_extents->m_t[0] = local_418.m_t[0];
  y_extents->m_t[1] = local_418.m_t[1];
  bVar1 = ON_BoundingBox::IsValid(&bbox);
  if ((!bVar1) || ((this->m_bValidCamera == false && (this->m_bValidFrustum != true)))) {
    return false;
  }
  local_478.z = (this->m_CamLoc).z;
  local_478.x = (this->m_CamLoc).x;
  local_478.y = (this->m_CamLoc).y;
  bVar1 = ON_3dPoint::IsValid(&local_478);
  if (!bVar1) {
    return false;
  }
  bVar1 = GetFarRect(this,&local_388,&local_370,&local_340,&local_358);
  if (!bVar1) {
    return false;
  }
  local_510 = x_extents;
  local_508 = y_extents;
  local_500 = this;
  ON_3dPoint::ON_3dPoint(&local_538,-1.23432101234321e+308,-1.23432101234321e+308,0.0);
  ON_BoundingBox::ON_BoundingBox(&local_4d8);
  local_4d8.m_min.z = local_538.z;
  local_4d8.m_max.z = local_538.z;
  from_pt.y = local_478.y;
  from_pt.x = local_478.x;
  from_pt.z = local_478.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(&local_328,from_pt,to_pt);
  uVar5 = 0;
  local_548 = local_278;
  do {
    local_328.to.z = (&local_388)[uVar5].z;
    local_328.to.x = (&local_388)[uVar5].x;
    local_328.to.y = (&local_388)[uVar5].y;
    local_518 = 1.0;
    if (1 < (int)uVar5 - 1U) {
      local_518 = -1.0;
    }
    local_520 = 1.0;
    if (uVar5 < 2) {
      local_520 = -1.0;
    }
    i_00 = 0;
    local_4f8 = uVar5;
    do {
      uVar9 = 0x3ff00000;
      if (i_00 != 0) {
        uVar9 = 0;
      }
      uVar10 = 0x3ff00000;
      if (i_00 != 1) {
        uVar10 = 0;
      }
      dVar11 = 1.0;
      if (i_00 != 2) {
        dVar11 = 0.0;
      }
      ON_PlaneEquation::ON_PlaneEquation
                ((ON_PlaneEquation *)local_278,(double)((ulong)uVar9 << 0x20),
                 (double)((ulong)uVar10 << 0x20),dVar11,0.0);
      iVar8 = 1;
      do {
        pOVar3 = (ON_BoundingBox *)&bbox.m_max;
        if (iVar8 == 1) {
          pOVar3 = &bbox;
        }
        local_2f8.m_xform[0][2] = (pOVar3->m_min).z;
        local_2f8.m_xform[0][0] = (pOVar3->m_min).x;
        local_2f8.m_xform[0][1] = (pOVar3->m_min).y;
        local_278[0].to.x = 0.0;
        pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)&local_2f8,i_00);
        local_278[0].to.x = -*pdVar4;
        local_4a8.from.x = -1.23432101234321e+308;
        bVar1 = ON_Intersect(&local_328,(ON_PlaneEquation *)local_278,(double *)&local_4a8);
        if (bVar1 && 0.0 < local_4a8.from.x) {
          ON_Line::PointAt((ON_3dPoint *)local_408,&local_328,local_4a8.from.x);
          pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)&local_2f8,i_00);
          dVar11 = *pdVar4;
          pdVar4 = ON_3dPoint::operator[]((ON_3dPoint *)local_408,i_00);
          *pdVar4 = dVar11;
          bVar1 = ON_BoundingBox::IsPointIn(&bbox,(ON_3dPoint *)local_408,0);
          if (bVar1) {
            local_538.x = local_518;
            local_538.y = local_520;
            ON_BoundingBox::Set(&local_4d8,&local_538,1);
          }
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 == 0);
      i_00 = i_00 + 1;
    } while (i_00 != 3);
    uVar5 = local_4f8 + 1;
  } while (uVar5 != 4);
  if (((((local_4d8.m_min.x != -1.0) || (NAN(local_4d8.m_min.x))) || (local_4d8.m_min.y != -1.0)) ||
      ((NAN(local_4d8.m_min.y) || (local_4d8.m_max.x != 1.0)))) ||
     ((NAN(local_4d8.m_max.x) || ((local_4d8.m_max.y != 1.0 || (NAN(local_4d8.m_max.y))))))) {
    ON_Xform::ON_Xform(&local_2f8);
    this_00 = local_500;
    bVar1 = GetXform(local_500,world_cs,clip_cs,&local_2f8);
    if (bVar1) {
      ON_PlaneEquation::ON_PlaneEquation(&local_438);
      bVar1 = GetNearPlaneEquation(this_00,&local_438);
      if (bVar1) {
        ON_PlaneEquation::ON_PlaneEquation(&local_458);
        bVar1 = GetFarPlaneEquation(this_00,&local_458);
        if (bVar1) {
          lVar6 = 0;
          do {
            ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)((long)&local_408[0].x + lVar6));
            lVar6 = lVar6 + 0x20;
          } while (lVar6 != 0x80);
          bVar1 = GetFrustumLeftPlaneEquation(this_00,local_408);
          if ((((bVar1) && (bVar1 = GetFrustumBottomPlaneEquation(this_00,local_408 + 1), bVar1)) &&
              (bVar1 = GetFrustumRightPlaneEquation(this_00,local_408 + 2), bVar1)) &&
             (bVar1 = GetFrustumTopPlaneEquation(this_00,local_408 + 3), bVar1)) {
            lVar6 = 0;
            do {
              ON_Line::ON_Line((ON_Line *)((long)&local_278[0].from.x + lVar6));
              lVar6 = lVar6 + 0x30;
            } while (lVar6 != 0x240);
            ON_BoundingBox::GetEdges(&bbox,local_278);
            lVar6 = 0;
            do {
              local_4a8.from.x = local_278[lVar6].from.x;
              local_4a8.from.y = local_278[lVar6].from.y;
              local_4a8.from.z = local_278[lVar6].from.z;
              local_4a8.to.x = local_278[lVar6].to.x;
              local_4a8.to.y = local_278[lVar6].to.y;
              local_4a8.to.z = local_278[lVar6].to.z;
              e_00.y = local_438.y;
              e_00.x = local_438.x;
              e_00.z = local_438.z;
              e_00.d = local_438.d;
              bVar1 = TrimLineHelper(e_00,true,&local_4a8);
              if ((bVar1) &&
                 (e_01.y = local_458.y, e_01.x = local_458.x, e_01.z = local_458.z,
                 e_01.d = local_458.d, bVar1 = TrimLineHelper(e_01,false,&local_4a8), bVar1)) {
                lVar7 = 0;
                do {
                  e_02.y = (double)*(undefined8 *)((long)&local_408[0].y + lVar7);
                  e_02.x = (double)*(undefined8 *)((long)&local_408[0].x + lVar7);
                  e_02.z = (double)*(undefined8 *)((long)&local_408[0].z + lVar7);
                  e_02.d = *(double *)((long)&local_408[0].d + lVar7);
                  bVar1 = TrimLineHelper(e_02,false,&local_4a8);
                  if (!bVar1) {
                    local_4a8.from.z = ON_3dPoint::UnsetPoint.z;
                    local_4a8.from.x = ON_3dPoint::UnsetPoint.x;
                    local_4a8.from.y = ON_3dPoint::UnsetPoint.y;
                    local_4a8.to.z = ON_3dPoint::UnsetPoint.z;
                    local_4a8.to.x = ON_3dPoint::UnsetPoint.x;
                    local_4a8.to.y = ON_3dPoint::UnsetPoint.y;
                    break;
                  }
                  lVar7 = lVar7 + 0x20;
                } while (lVar7 != 0x80);
                bVar1 = ON_Line::IsValid(&local_4a8);
                if (bVar1) {
                  ON_Xform::operator*(&local_4f0,&local_2f8,&local_4a8.from);
                  local_538.z = local_4f0.z;
                  local_538.x = local_4f0.x;
                  local_538.y = local_4f0.y;
                  ON_BoundingBox::Set(&local_4d8,&local_538,1);
                  ON_Xform::operator*(&local_4f0,&local_2f8,&local_4a8.to);
                  local_538.z = local_4f0.z;
                  local_538.x = local_4f0.x;
                  local_538.y = local_4f0.y;
                  ON_BoundingBox::Set(&local_4d8,&local_538,1);
                }
              }
              ON_Line::~ON_Line(&local_4a8);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0xc);
            lVar6 = 0x210;
            do {
              ON_Line::~ON_Line((ON_Line *)((long)&local_278[0].from.x + lVar6));
              lVar6 = lVar6 + -0x30;
            } while (lVar6 != -0x30);
            goto LAB_0067bbb8;
          }
        }
      }
    }
    bVar1 = false;
  }
  else {
LAB_0067bbb8:
    bVar1 = ON_BoundingBox::IsValid(&local_4d8);
    if (bVar1) {
      lVar6 = 0;
      do {
        ON_Interval::ON_Interval((ON_Interval *)((long)&local_278[0].from.x + lVar6));
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x20);
      lVar6 = 0;
      do {
        pdVar4 = ON_3dPoint::operator[](&local_4d8.m_min,(int)lVar6);
        dVar11 = *pdVar4;
        pdVar4 = ON_3dPoint::operator[](&local_4d8.m_max,(int)lVar6);
        ON_Interval::Set((ON_Interval *)local_548,(dVar11 + 1.0) * 0.5,(*pdVar4 + 1.0) * 0.5);
        bVar2 = ON_Interval::IsIncreasing((ON_Interval *)local_548);
        if ((((!bVar2) && (bVar2 = ON_Interval::IsSingleton((ON_Interval *)local_548), !bVar2)) ||
            ((bVar2 = ON_Interval::Intersection((ON_Interval *)local_548,&local_418), !bVar2 ||
             (bVar2 = ON_Interval::IsValid((ON_Interval *)local_548), !bVar2)))) ||
           ((bVar2 = ON_Interval::IsIncreasing((ON_Interval *)local_548), !bVar2 &&
            (bVar2 = ON_Interval::IsSingleton((ON_Interval *)local_548), !bVar2)))) {
          bVar1 = false;
          break;
        }
        lVar6 = lVar6 + 1;
        local_548 = (ON_Line *)&(local_548->from).z;
      } while (lVar6 == 1);
      if (bVar1 != false) {
        local_510->m_t[0] = local_278[0].from.x;
        local_510->m_t[1] = local_278[0].from.y;
        local_508->m_t[0] = local_278[0].from.z;
        local_508->m_t[1] = local_278[0].to.x;
      }
    }
  }
  ON_Line::~ON_Line(&local_328);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetBoundingBoxProjectionExtents(
    ON_BoundingBox bbox,
    ON_Interval& x_extents,
    ON_Interval& y_extents
    ) const
{
  const ON_Interval unit_interval(0.0,1.0);
  x_extents = unit_interval;
  y_extents = unit_interval;

  if ( !bbox.IsValid() )
    return false;

  if ( !IsValidCamera() && !IsValidFrustum() )
    return false;

  const ON_3dPoint cam_loc = CameraLocation();
  if ( !cam_loc.IsValid() )
    return false;

  // far_rect[] points run image ccw 
  // (image lower left, lower right, upper right, upper left)
  ON_3dPoint far_rect[4];
  if ( !GetFarRect(far_rect[0],far_rect[1],far_rect[3],far_rect[2]) )
    return false;

  ON_3dPoint clipping_point(ON_UNSET_VALUE,ON_UNSET_VALUE,0.0);
  ON_BoundingBox clipping_bbox;
  clipping_bbox.m_min.z = clipping_point.z;
  clipping_bbox.m_max.z = clipping_point.z;

  ON_Line camera_ray(cam_loc,ON_3dPoint::UnsetPoint);
  for ( int i = 0; i < 4; i++ )
  {
    camera_ray.to = far_rect[i];
    for ( int j = 0; j < 3; j++ )
    {
      ON_PlaneEquation e(0==j ? 1.0 : 0.0, 1 == j ? 1.0 : 0.0, 2==j?1.0:0.0, 0.0);
      for ( int k = 0; k < 2; k++ )
      {
        ON_3dPoint bbox_point = k ? bbox.m_max : bbox.m_min;
        e.d = 0.0;
        e.d = -bbox_point[j];
        double t = ON_UNSET_VALUE;
        if ( ON_Intersect(camera_ray,e,&t) )
        {
          if ( t > 0.0 )
          {
            ON_3dPoint P = camera_ray.PointAt(t);
            P[j] = bbox_point[j];
            if ( bbox.IsPointIn(P) )
            {
              clipping_point.x = (1 == i || 2 == i) ? 1.0 : -1.0;
              clipping_point.y = (i >= 2) ? 1.0 : -1.0;
              clipping_bbox.Set(clipping_point,true);
            }
          }
        }
      }
    }
  }

  if (    clipping_bbox.m_min.x != -1.0 || clipping_bbox.m_min.y != -1.0
       || clipping_bbox.m_max.x !=  1.0 || clipping_bbox.m_max.y !=  1.0
     )
  {
    ON_Xform w2c;
    if ( !GetXform(ON::world_cs,ON::clip_cs,w2c) )
      return false;

    ON_PlaneEquation vp_near_plane;
    if ( !GetNearPlaneEquation(vp_near_plane) )
      return false;

    ON_PlaneEquation vp_far_plane;
    if ( !GetFarPlaneEquation(vp_far_plane) )
      return false;

    ON_PlaneEquation frustum_sides[4];
    if ( !GetFrustumLeftPlaneEquation(frustum_sides[0]) )
      return false;
    if ( !GetFrustumBottomPlaneEquation(frustum_sides[1]) )
      return false;
    if ( !GetFrustumRightPlaneEquation(frustum_sides[2]) )
      return false;
    if ( !GetFrustumTopPlaneEquation(frustum_sides[3]) )
      return false;

    ON_Line bbox_lines[12];
    bbox.GetEdges(bbox_lines);

    for ( int i = 0; i < 12; i++ )
    {
      ON_Line line = bbox_lines[i];

      if ( !TrimLineHelper( vp_near_plane, true, line ) )
        continue;

      if ( !TrimLineHelper( vp_far_plane, false, line ) )
        continue;

      for ( int j = 0; j < 4; j++ )
      {
        if ( !TrimLineHelper(frustum_sides[j],false,line) )
        {
          line.from = ON_3dPoint::UnsetPoint;
          line.to = ON_3dPoint::UnsetPoint;
          break;
        }
      }

      if ( !line.IsValid() )
        continue;      

      clipping_point = w2c*line.from;
      clipping_bbox.Set(clipping_point,true);

      clipping_point = w2c*line.to;
      clipping_bbox.Set(clipping_point,true);
    }
  }

  bool rc = clipping_bbox.IsValid();

  if ( rc )
  {
    ON_Interval extents[2];
    for ( int i = 0; i < 2; i++ )
    {
      extents[i].Set( 
        0.5*(clipping_bbox.m_min[i]+1.0),
        0.5*(clipping_bbox.m_max[i]+1.0)
        );    
      
      if ( extents[i].IsIncreasing() || extents[i].IsSingleton() )
      {
        if ( extents[i].Intersection(unit_interval) && extents[i].IsValid() )
        {
          if ( extents[i].IsIncreasing() )
            continue;
          if ( extents[i].IsSingleton() )
            continue;
        }
      }

      rc = false;
      break;
    }

    if ( rc )
    {
      x_extents = extents[0];
      y_extents = extents[1];
    }
  }


  return rc;
}